

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

void __thiscall leveldb::MemTableIterator::Seek(MemTableIterator *this,Slice *k)

{
  Iterator *this_00;
  string *in_RSI;
  long in_RDI;
  char **in_stack_ffffffffffffffd8;
  Slice *in_stack_ffffffffffffffe8;
  
  this_00 = (Iterator *)(in_RDI + 0x28);
  EncodeKey(in_RSI,in_stack_ffffffffffffffe8);
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Seek
            (this_00,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Seek(const Slice& k) override { iter_.Seek(EncodeKey(&tmp_, k)); }